

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O1

char * __cxxabiv1::anon_unknown_0::parse_substitution<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  uint uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar3;
  char cVar4;
  pointer psVar5;
  pointer pvVar6;
  value_type *pvVar7;
  Db *this;
  int iVar8;
  ulong uVar9;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *n_1;
  value_type *__x;
  ulong uVar10;
  int iVar11;
  char *pcVar12;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *n;
  pointer __x_00;
  bool bVar13;
  size_type __dnew;
  value_type local_80;
  Db *local_40;
  _Alloc_hider local_38;
  
  if ((long)last - (long)first < 2) {
    return first;
  }
  if (*first != 'S') {
    return first;
  }
  cVar4 = first[1];
  switch(cVar4) {
  case '_':
    pvVar6 = (db->subs).
             super__Vector_base<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pvVar6 == (db->subs).
                  super__Vector_base<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return first;
    }
    psVar5 = (pvVar6->
             super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (__x_00 = (pvVar6->
                  super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                  )._M_impl.super__Vector_impl_data._M_start; __x_00 != psVar5; __x_00 = __x_00 + 1)
    {
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,__x_00);
    }
    goto LAB_001960f7;
  case '`':
  case 'c':
  case 'e':
  case 'f':
  case 'g':
  case 'h':
switchD_00195ddf_caseD_60:
    iVar11 = (int)cVar4;
    uVar1 = iVar11 - 0x30;
    local_40 = db;
    if ((9 < uVar1) && (iVar8 = isupper(iVar11), iVar8 == 0)) {
      return first;
    }
    pcVar12 = first + 2;
    bVar13 = pcVar12 == last;
    if (bVar13) {
      return first;
    }
    uVar10 = (ulong)uVar1;
    if (9 < uVar1) {
      uVar10 = (long)iVar11 - 0x37;
    }
    while( true ) {
      iVar11 = (int)*pcVar12;
      uVar1 = iVar11 - 0x30;
      if ((9 < uVar1) && (iVar8 = isupper(iVar11), this = local_40, iVar8 == 0)) break;
      uVar9 = (ulong)uVar1;
      if (9 < uVar1) {
        uVar9 = (long)iVar11 - 0x37;
      }
      uVar10 = uVar9 + uVar10 * 0x24;
      pcVar12 = pcVar12 + 1;
      bVar13 = pcVar12 == last;
      if (bVar13) {
        return first;
      }
    }
    if (bVar13) {
      return first;
    }
    if (*pcVar12 != '_') {
      return first;
    }
    uVar10 = uVar10 + 1;
    pvVar6 = (local_40->subs).
             super__Vector_base<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_40->subs).
                      super__Vector_base<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<std::vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>,_4096UL>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 5) <= uVar10) {
      return first;
    }
    pvVar7 = pvVar6[uVar10].
             super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__x = pvVar6[uVar10].
               super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
               ._M_impl.super__Vector_impl_data._M_start; __x != pvVar7; __x = __x + 1) {
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&this->names,__x);
    }
    return pcVar12 + 1;
  case 'a':
    local_80.first._M_dataplus._M_p = (pointer)&local_80.first.field_2;
    local_80.first.field_2._M_allocated_capacity._0_5_ = 0x3a3a647473;
    local_80.first.field_2._M_local_buf[5] = 'a';
    local_80.first.field_2._M_local_buf[6] = 'l';
    local_80.first.field_2._7_4_ = 0x61636f6c;
    local_80.first.field_2._M_local_buf[0xb] = 't';
    local_80.first.field_2._M_local_buf[0xc] = 'o';
    local_80.first.field_2._M_local_buf[0xd] = 'r';
    local_80.first._M_string_length = 0xe;
    local_80.first.field_2._M_local_buf[0xe] = '\0';
    local_80.second._M_dataplus._M_p = (pointer)&local_80.second.field_2;
    local_80.second._M_string_length = 0;
    local_80.second.field_2._M_local_buf[0] = '\0';
    std::
    vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ::push_back(&db->names,&local_80);
    break;
  case 'b':
    paVar2 = &local_80.first.field_2;
    local_38._M_p = (pointer)0x11;
    local_80.first._M_dataplus._M_p = (pointer)paVar2;
    local_80.first._M_dataplus._M_p =
         std::__cxx11::
         basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
         ::_M_create((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                      *)&local_38,(size_type *)0x0,0x30d238);
    local_80.first.field_2._M_allocated_capacity._0_5_ = SUB85(local_38._M_p,0);
    local_80.first.field_2._M_local_buf[5] = (char)((ulong)local_38._M_p >> 0x28);
    local_80.first.field_2._M_local_buf[6] = (char)((ulong)local_38._M_p >> 0x30);
    local_80.first.field_2._M_local_buf[7] = (char)((ulong)local_38._M_p >> 0x38);
    builtin_strncpy(local_80.first._M_dataplus._M_p,"std::basic_string",0x11);
    local_80.first._M_string_length = (size_type)local_38._M_p;
    local_80.first._M_dataplus._M_p[local_38._M_p] = '\0';
    paVar3 = &local_80.second.field_2;
    local_80.second._M_string_length = 0;
    local_80.second.field_2._M_local_buf[0] = '\0';
    local_80.second._M_dataplus._M_p = (pointer)paVar3;
    std::
    vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ::push_back(&db->names,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_80.second._M_dataplus._M_p != paVar3) {
      free(local_80.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
         *)local_80.first._M_dataplus._M_p != paVar2) {
      free(local_80.first._M_dataplus._M_p);
    }
    goto LAB_001960f7;
  case 'd':
    local_80.first._M_dataplus._M_p = (pointer)&local_80.first.field_2;
    local_80.first.field_2._M_allocated_capacity._0_5_ = 0x3a3a647473;
    local_80.first.field_2._M_local_buf[5] = 'i';
    local_80.first.field_2._M_local_buf[6] = 'o';
    local_80.first.field_2._7_4_ = 0x65727473;
    local_80.first.field_2._M_local_buf[0xb] = 'a';
    local_80.first.field_2._M_local_buf[0xc] = 'm';
    local_80.first._M_string_length = 0xd;
    local_80.first.field_2._M_local_buf[0xd] = '\0';
    local_80.second._M_dataplus._M_p = (pointer)&local_80.second.field_2;
    local_80.second._M_string_length = 0;
    local_80.second.field_2._M_local_buf[0] = '\0';
    std::
    vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ::push_back(&db->names,&local_80);
    break;
  case 'i':
    local_80.first._M_dataplus._M_p = (pointer)&local_80.first.field_2;
    local_80.first.field_2._M_allocated_capacity._0_5_ = 0x3a3a647473;
    local_80.first.field_2._M_local_buf[5] = 'i';
    local_80.first.field_2._M_local_buf[6] = 's';
    local_80.first.field_2._7_4_ = 0x61657274;
    local_80.first.field_2._M_local_buf[0xb] = 'm';
    local_80.first._M_string_length = 0xc;
    local_80.first.field_2._M_local_buf[0xc] = '\0';
    local_80.second._M_dataplus._M_p = (pointer)&local_80.second.field_2;
    local_80.second._M_string_length = 0;
    local_80.second.field_2._M_local_buf[0] = '\0';
    std::
    vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ::push_back(&db->names,&local_80);
    break;
  default:
    if (cVar4 == 'o') {
      local_80.first._M_dataplus._M_p = (pointer)&local_80.first.field_2;
      local_80.first.field_2._M_allocated_capacity._0_5_ = 0x3a3a647473;
      local_80.first.field_2._M_local_buf[5] = 'o';
      local_80.first.field_2._M_local_buf[6] = 's';
      local_80.first.field_2._7_4_ = 0x61657274;
      local_80.first.field_2._M_local_buf[0xb] = 'm';
      local_80.first._M_string_length = 0xc;
      local_80.first.field_2._M_local_buf[0xc] = '\0';
      local_80.second._M_dataplus._M_p = (pointer)&local_80.second.field_2;
      local_80.second._M_string_length = 0;
      local_80.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_80);
    }
    else {
      if (cVar4 != 's') goto switchD_00195ddf_caseD_60;
      local_80.first._M_dataplus._M_p = (pointer)&local_80.first.field_2;
      local_80.first.field_2._M_allocated_capacity._0_5_ = 0x3a3a647473;
      local_80.first.field_2._M_local_buf[5] = 's';
      local_80.first.field_2._M_local_buf[6] = 't';
      local_80.first.field_2._7_4_ = 0x676e6972;
      local_80.first._M_string_length = 0xb;
      local_80.first.field_2._M_local_buf[0xb] = '\0';
      local_80.second._M_dataplus._M_p = (pointer)&local_80.second.field_2;
      local_80.second._M_string_length = 0;
      local_80.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_80);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_80.second._M_dataplus._M_p != &local_80.second.field_2) {
    free(local_80.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
    free(local_80.first._M_dataplus._M_p);
  }
LAB_001960f7:
  return first + 2;
}

Assistant:

const char*
parse_substitution(const char* first, const char* last, C& db)
{
    if (last - first >= 2)
    {
        if (*first == 'S')
        {
            switch (first[1])
            {
            case 'a':
                db.names.push_back("std::allocator");
                first += 2;
                break;
            case 'b':
                db.names.push_back("std::basic_string");
                first += 2;
                break;
            case 's':
                db.names.push_back("std::string");
                first += 2;
                break;
            case 'i':
                db.names.push_back("std::istream");
                first += 2;
                break;
            case 'o':
                db.names.push_back("std::ostream");
                first += 2;
                break;
            case 'd':
                db.names.push_back("std::iostream");
                first += 2;
                break;
            case '_':
                if (!db.subs.empty())
                {
                    for (const auto& n : db.subs.front())
                        db.names.push_back(n);
                    first += 2;
                }
                break;
            default:
                if (std::isdigit(first[1]) || std::isupper(first[1]))
                {
                    size_t sub = 0;
                    const char* t = first+1;
                    if (std::isdigit(*t))
                        sub = static_cast<size_t>(*t - '0');
                    else
                        sub = static_cast<size_t>(*t - 'A') + 10;
                    for (++t; t != last && (std::isdigit(*t) || std::isupper(*t)); ++t)
                    {
                        sub *= 36;
                        if (std::isdigit(*t))
                            sub += static_cast<size_t>(*t - '0');
                        else
                            sub += static_cast<size_t>(*t - 'A') + 10;
                    }
                    if (t == last || *t != '_')
                        return first;
                    ++sub;
                    if (sub < db.subs.size())
                    {
                        for (const auto& n : db.subs[sub])
                            db.names.push_back(n);
                        first = t+1;
                    }
                }
                break;
            }
        }
    }
    return first;
}